

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseChassisInformation(EeePChassisInfo_t *info)

{
  byte bVar1;
  uint8_t *base;
  char *pcVar2;
  char *str;
  void *strstart;
  EeePChassisInfo_t *info_local;
  
  base = &info->CElement[0].ElementType + (int)((uint)info->CElementCnt * (uint)info->CElementSize);
  pcVar2 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Manufacturer: %s\n",pcVar2);
  }
  bVar1 = info->Type;
  pcVar2 = FindChassisTypeText(info->Type);
  printf("      Chassis Type: %d (%s)\n",(ulong)bVar1,pcVar2);
  pcVar2 = GetSmbiosString(info->Version,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Version: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Serial Number: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->AssetTagNumber,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Asset Tag: %s\n",pcVar2);
  }
  printf("      Height: %dU\n",(ulong)info->Height);
  printf("      Number of Power Cords: %d\n",(ulong)info->NumPowerCords);
  return;
}

Assistant:

void ParseChassisInformation(EeePChassisInfo_t *info)
{
    void *strstart = (unsigned char *)info->CElement + info->CElementCnt * info->CElementSize;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    printf("      Chassis Type: %d (%s)\n",
        info->Type, FindChassisTypeText(info->Type));
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTagNumber, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    printf("      Height: %dU\n", info->Height);
    printf("      Number of Power Cords: %d\n", info->NumPowerCords);
}